

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O0

mraa_result_t mraa_pwm_write_duty(mraa_pwm_context dev,int duty)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ssize_t sVar5;
  char local_68 [4];
  int length;
  char bu [64];
  int duty_local;
  mraa_pwm_context dev_local;
  
  if (dev == (mraa_pwm_context)0x0) {
    syslog(3,"pwm: write_duty: context is NULL");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else if (((dev == (mraa_pwm_context)0x0) || (dev->advance_func == (mraa_adv_func_t *)0x0)) ||
          (dev->advance_func->pwm_write_replace == (_func_mraa_result_t_mraa_pwm_context_float *)0x0
          )) {
    if ((dev->duty_fp == -1) && (iVar2 = mraa_pwm_setup_duty_fp(dev), iVar2 == 1)) {
      uVar1 = dev->pin;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      syslog(3,"pwm%i write_duty: Failed to open duty_cycle for writing: %s",(ulong)uVar1,pcVar4);
      dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
    }
    else {
      iVar2 = snprintf(local_68,0x40,"%d",(ulong)(uint)duty);
      sVar5 = write(dev->duty_fp,local_68,(long)iVar2);
      if (sVar5 == -1) {
        uVar1 = dev->pin;
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        syslog(3,"pwm%i write_duty: Failed to write to duty_cycle: %s",(ulong)uVar1,pcVar4);
        dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
      }
      else {
        dev_local._4_4_ = MRAA_SUCCESS;
      }
    }
  }
  else {
    dev_local._4_4_ = (*dev->advance_func->pwm_write_replace)(dev,(float)duty);
  }
  return dev_local._4_4_;
}

Assistant:

static mraa_result_t
mraa_pwm_write_duty(mraa_pwm_context dev, int duty)
{
    if (!dev) {
        syslog(LOG_ERR, "pwm: write_duty: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, pwm_write_replace)) {
        return dev->advance_func->pwm_write_replace(dev, duty);
    }
    if (dev->duty_fp == -1) {
        if (mraa_pwm_setup_duty_fp(dev) == 1) {
            syslog(LOG_ERR, "pwm%i write_duty: Failed to open duty_cycle for writing: %s", dev->pin, strerror(errno));
            return MRAA_ERROR_INVALID_RESOURCE;
        }
    }
    char bu[MAX_SIZE];
    int length = snprintf(bu, MAX_SIZE, "%d", duty);
    if (write(dev->duty_fp, bu, length * sizeof(char)) == -1)
    {
        syslog(LOG_ERR, "pwm%i write_duty: Failed to write to duty_cycle: %s", dev->pin, strerror(errno));
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    return MRAA_SUCCESS;
}